

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QDockWidget * __thiscall QList<QDockWidget_*>::takeAt(QList<QDockWidget_*> *this,qsizetype i)

{
  QDockWidget *pQVar1;
  Data *pDVar2;
  pointer ppQVar3;
  
  ppQVar3 = data(this);
  pQVar1 = ppQVar3[i];
  pDVar2 = (this->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QDockWidget_*>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QDockWidget_*> *)0x0);
  }
  QtPrivate::QPodArrayOps<QDockWidget_*>::erase
            ((QPodArrayOps<QDockWidget_*> *)this,(this->d).ptr + i,1);
  return pQVar1;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }